

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

bool duckdb::Optimizer::OptimizerDisabled(ClientContext *context_p,OptimizerType type)

{
  DBConfig *pDVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  pDVar1 = DBConfig::GetConfig(context_p);
  p_Var4 = (pDVar1->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var2 = &(pDVar1->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var2->_M_header;
  p_Var5 = &p_Var2->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar6 = p_Var4[1]._M_color < type;
      if (!bVar6) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var5 = p_Var3, type < p_Var3[1]._M_color)) {
      p_Var5 = &p_Var2->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var5 != p_Var2;
}

Assistant:

bool Optimizer::OptimizerDisabled(ClientContext &context_p, OptimizerType type) {
	auto &config = DBConfig::GetConfig(context_p);
	return config.options.disabled_optimizers.find(type) != config.options.disabled_optimizers.end();
}